

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

bool __thiscall Catch::Matchers::WithinUlpsMatcher::match(WithinUlpsMatcher *this,double *matchee)

{
  ReusableStringStream *pRVar1;
  SourceLineInfo local_60;
  ReusableStringStream local_50;
  string local_40;
  double *local_20;
  double *matchee_local;
  WithinUlpsMatcher *this_local;
  
  local_20 = matchee;
  matchee_local = (double *)this;
  if (this->m_type == Float) {
    this_local._7_1_ =
         anon_unknown_23::almostEqualUlps<float>((float)*matchee,(float)this->m_target,this->m_ulps)
    ;
  }
  else {
    if (this->m_type != Double) {
      ReusableStringStream::ReusableStringStream(&local_50);
      SourceLineInfo::SourceLineInfo
                (&local_60,
                 "/workspace/llm4binary/github/license_c_cmakelists/H-EAL[P]oqpi/tests/catch_amalgamated.cpp"
                 ,0x19cd);
      pRVar1 = ReusableStringStream::operator<<(&local_50,&local_60);
      pRVar1 = ReusableStringStream::operator<<(pRVar1,(char (*) [26])": Internal Catch2 error: ");
      pRVar1 = ReusableStringStream::operator<<
                         (pRVar1,(char (*) [40])"Unknown Detail::FloatingPointKind value");
      ReusableStringStream::str_abi_cxx11_(&local_40,pRVar1);
      throw_logic_error(&local_40);
    }
    this_local._7_1_ =
         anon_unknown_23::almostEqualUlps<double>(*matchee,this->m_target,this->m_ulps);
  }
  return this_local._7_1_;
}

Assistant:

bool WithinUlpsMatcher::match(double const &matchee) const {
            switch (m_type) {
            case Detail::FloatingPointKind::Float:
                return almostEqualUlps<float>(static_cast<float>(matchee), static_cast<float>(m_target), m_ulps);
            case Detail::FloatingPointKind::Double:
                return almostEqualUlps<double>(matchee, m_target, m_ulps);
            default:
                CATCH_INTERNAL_ERROR("Unknown Detail::FloatingPointKind value");
            }
        }